

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O1

_Bool gravity_hash_remove(gravity_hash_t *hashtable,gravity_value_t key)

{
  gravity_hash_iterate_fn p_Var1;
  ulong uVar2;
  hash_node_t *phVar3;
  _Bool _Var4;
  uint32_t uVar5;
  hash_node_t *__ptr;
  hash_node_t *phVar6;
  hash_node_s **pphVar7;
  _Bool _Var8;
  
  uVar5 = (*hashtable->compute_fn)(key);
  uVar2 = (ulong)uVar5 % (ulong)hashtable->size;
  _Var8 = hashtable->nodes[uVar2] != (hash_node_t *)0x0;
  if (_Var8) {
    p_Var1 = hashtable->free_fn;
    phVar3 = hashtable->nodes[uVar2];
    phVar6 = (hash_node_t *)0x0;
    do {
      __ptr = phVar3;
      if ((__ptr->hash == uVar5) && (_Var4 = (*hashtable->isequal_fn)(key,__ptr->key), _Var4)) {
        if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
          (*p_Var1)(hashtable,__ptr->key,__ptr->value,hashtable->data);
        }
        if (phVar6 == (hash_node_t *)0x0) {
          pphVar7 = hashtable->nodes + uVar2;
        }
        else {
          pphVar7 = &phVar6->next;
        }
        *pphVar7 = __ptr->next;
        free(__ptr);
        hashtable->count = hashtable->count - 1;
        return _Var8;
      }
      _Var8 = __ptr->next != (hash_node_s *)0x0;
      phVar3 = __ptr->next;
      phVar6 = __ptr;
    } while (_Var8);
  }
  return _Var8;
}

Assistant:

bool gravity_hash_remove (gravity_hash_t *hashtable, gravity_value_t key) {
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    gravity_hash_iterate_fn free_fn = hashtable->free_fn;
    hash_node_t *node = hashtable->nodes[position];
    hash_node_t *prevnode = NULL;
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            if (prevnode) prevnode->next = node->next;
            else hashtable->nodes[position] = node->next;
            mem_free(node);
            hashtable->count--;
            return true;
        }

        prevnode = node;
        node = node->next;
    }

    return false;
}